

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O2

void __thiscall
prevector_tests::prevector_tester<8U,_int>::prevector_tester
          (prevector_tester<8U,_int> *this,FastRandomContext *rng)

{
  uint256 *puVar1;
  base_blob<256U> *pbVar2;
  long in_FS_OFFSET;
  uint256 local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(this->pre_vector_alt)._union + 0x10) = 0;
  *(undefined8 *)((long)&(this->pre_vector_alt)._union + 0x18) = 0;
  (this->pre_vector_alt)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(this->pre_vector_alt)._union + 8) = 0;
  (this->pre_vector_alt)._size = 0;
  (this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->real_vector_alt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->real_vector_alt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->real_vector_alt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pre_vector)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(this->pre_vector)._union + 8) = 0;
  *(undefined8 *)((long)&(this->pre_vector)._union + 0x10) = 0;
  *(undefined8 *)((long)&(this->pre_vector)._union + 0x18) = 0;
  (this->pre_vector)._size = 0;
  this->passed = true;
  puVar1 = &this->rand_seed;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar2 = &(this->rand_seed).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[8] = '\0';
  (pbVar2->m_data)._M_elems[9] = '\0';
  (pbVar2->m_data)._M_elems[10] = '\0';
  (pbVar2->m_data)._M_elems[0xb] = '\0';
  (pbVar2->m_data)._M_elems[0xc] = '\0';
  (pbVar2->m_data)._M_elems[0xd] = '\0';
  (pbVar2->m_data)._M_elems[0xe] = '\0';
  (pbVar2->m_data)._M_elems[0xf] = '\0';
  pbVar2 = &(this->rand_seed).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x10] = '\0';
  (pbVar2->m_data)._M_elems[0x11] = '\0';
  (pbVar2->m_data)._M_elems[0x12] = '\0';
  (pbVar2->m_data)._M_elems[0x13] = '\0';
  (pbVar2->m_data)._M_elems[0x14] = '\0';
  (pbVar2->m_data)._M_elems[0x15] = '\0';
  (pbVar2->m_data)._M_elems[0x16] = '\0';
  (pbVar2->m_data)._M_elems[0x17] = '\0';
  pbVar2 = &(this->rand_seed).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x18] = '\0';
  (pbVar2->m_data)._M_elems[0x19] = '\0';
  (pbVar2->m_data)._M_elems[0x1a] = '\0';
  (pbVar2->m_data)._M_elems[0x1b] = '\0';
  (pbVar2->m_data)._M_elems[0x1c] = '\0';
  (pbVar2->m_data)._M_elems[0x1d] = '\0';
  (pbVar2->m_data)._M_elems[0x1e] = '\0';
  (pbVar2->m_data)._M_elems[0x1f] = '\0';
  RandomMixin<FastRandomContext>::rand256(&local_48,&rng->super_RandomMixin<FastRandomContext>);
  *(undefined8 *)((this->rand_seed).super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_48.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)((this->rand_seed).super_base_blob<256U>.m_data._M_elems + 0x18) =
       local_48.super_base_blob<256U>.m_data._M_elems._24_8_;
  *(undefined8 *)(this->rand_seed).super_base_blob<256U>.m_data._M_elems =
       local_48.super_base_blob<256U>.m_data._M_elems._0_8_;
  *(undefined8 *)((this->rand_seed).super_base_blob<256U>.m_data._M_elems + 8) =
       local_48.super_base_blob<256U>.m_data._M_elems._8_8_;
  FastRandomContext::Reseed(rng,&this->rand_seed);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

prevector_tester(FastRandomContext& rng) {
        rand_seed = rng.rand256();
        rng.Reseed(rand_seed);
    }